

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSWriteSub(UConverterFromUnicodeArgs *pArgs,int32_t offsetIndex,UErrorCode *pErrorCode)

{
  UConverter *pUVar1;
  uint local_44;
  int local_40;
  uint8_t local_3c;
  char local_3b [3];
  int32_t length;
  char buffer [4];
  char *subchar;
  char *p;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  int32_t offsetIndex_local;
  UConverterFromUnicodeArgs *pArgs_local;
  
  pUVar1 = pArgs->converter;
  if (pUVar1->subChar1 != '\0') {
    if ((pUVar1->sharedData->mbcs).extIndexes == (int32_t *)0x0) {
      local_44 = (uint)((ushort)pUVar1->invalidUCharBuffer[0] < 0x100);
    }
    else {
      local_44 = (uint)pUVar1->useSubChar1;
    }
    if (local_44 != 0) {
      _length = &pUVar1->subChar1;
      local_40 = 1;
      goto LAB_001956ea;
    }
  }
  _length = pUVar1->subChars;
  local_40 = (int)pUVar1->subCharLen;
LAB_001956ea:
  pUVar1->useSubChar1 = '\0';
  if ((pUVar1->sharedData->mbcs).outputType == '\f') {
    subchar = (char *)&local_3c;
    if (local_40 == 1) {
      if (pUVar1->fromUnicodeStatus == 2) {
        pUVar1->fromUnicodeStatus = 1;
        subchar = local_3b;
        local_3c = '\x0f';
      }
      *subchar = *_length;
      subchar._0_4_ = (int)subchar + 1;
    }
    else {
      if (local_40 != 2) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      if (pUVar1->fromUnicodeStatus < 2) {
        pUVar1->fromUnicodeStatus = 2;
        subchar = local_3b;
        local_3c = '\x0e';
      }
      *subchar = *_length;
      subchar[1] = _length[1];
      subchar._0_4_ = (int)subchar + 2;
    }
    _length = &local_3c;
    local_40 = (int)subchar - (int)&local_3c;
  }
  ucnv_cbFromUWriteBytes_63(pArgs,(char *)_length,local_40,offsetIndex,pErrorCode);
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSWriteSub(UConverterFromUnicodeArgs *pArgs,
              int32_t offsetIndex,
              UErrorCode *pErrorCode) {
    UConverter *cnv=pArgs->converter;
    char *p, *subchar;
    char buffer[4];
    int32_t length;

    /* first, select between subChar and subChar1 */
    if( cnv->subChar1!=0 &&
        (cnv->sharedData->mbcs.extIndexes!=NULL ?
            cnv->useSubChar1 :
            (cnv->invalidUCharBuffer[0]<=0xff))
    ) {
        /* select subChar1 if it is set (not 0) and the unmappable Unicode code point is up to U+00ff (IBM MBCS behavior) */
        subchar=(char *)&cnv->subChar1;
        length=1;
    } else {
        /* select subChar in all other cases */
        subchar=(char *)cnv->subChars;
        length=cnv->subCharLen;
    }

    /* reset the selector for the next code point */
    cnv->useSubChar1=FALSE;

    if (cnv->sharedData->mbcs.outputType == MBCS_OUTPUT_2_SISO) {
        p=buffer;

        /* fromUnicodeStatus contains prevLength */
        switch(length) {
        case 1:
            if(cnv->fromUnicodeStatus==2) {
                /* DBCS mode and SBCS sub char: change to SBCS */
                cnv->fromUnicodeStatus=1;
                *p++=UCNV_SI;
            }
            *p++=subchar[0];
            break;
        case 2:
            if(cnv->fromUnicodeStatus<=1) {
                /* SBCS mode and DBCS sub char: change to DBCS */
                cnv->fromUnicodeStatus=2;
                *p++=UCNV_SO;
            }
            *p++=subchar[0];
            *p++=subchar[1];
            break;
        default:
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        subchar=buffer;
        length=(int32_t)(p-buffer);
    }

    ucnv_cbFromUWriteBytes(pArgs, subchar, length, offsetIndex, pErrorCode);
}